

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O2

void __thiscall
spvtools::opt::LoopDependenceAnalysis::LoopDependenceAnalysis
          (LoopDependenceAnalysis *this,IRContext *context,
          vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *loops)

{
  this->context_ = context;
  std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
            (&this->loops_,loops);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(&this->scalar_evolution_,context);
  this->debug_stream_ = (ostream *)0x0;
  (this->constraints_).
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->constraints_;
  (this->constraints_).
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->constraints_;
  (this->constraints_).
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

LoopDependenceAnalysis(IRContext* context, std::vector<const Loop*> loops)
      : context_(context),
        loops_(loops),
        scalar_evolution_(context),
        debug_stream_(nullptr),
        constraints_{} {}